

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void __thiscall GB::sub_mr(GB *this,u16 mr)

{
  u8 uVar1;
  
  if ((this->s).op_tick == 0xe) {
    uVar1 = Read(this,mr);
    uVar1 = sub(this,uVar1,'\0');
    (this->s).field_2.field_0.a = uVar1;
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::sub_mr(u16 mr) {
  switch (s.op_tick) {
    case 14: s.a = sub(Read(mr)); op_done(); break;
  }
}